

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int balloc(bstring b,int len)

{
  uint uVar1;
  uint uVar2;
  uchar *__src;
  uchar *__dest;
  uint uVar3;
  int iVar4;
  
  iVar4 = -1;
  if ((b != (bstring)0x0) && (__src = b->data, __src != (uchar *)0x0)) {
    uVar1 = b->slen;
    if ((-1 < (long)(int)uVar1) &&
       ((uVar2 = b->mlen, 0 < (int)uVar2 && (0 < len && uVar1 <= uVar2)))) {
      if (uVar2 <= (uint)len) {
        uVar3 = 8;
        if ((7 < (uint)len) &&
           (uVar3 = (uint)len >> 1 | len, uVar3 = uVar3 >> 2 | uVar3, uVar3 = uVar3 >> 4 | uVar3,
           uVar3 = uVar3 >> 8 | uVar3, uVar3 = (uVar3 >> 0x10 | uVar3) + 1, (int)uVar3 <= len)) {
          uVar3 = len;
        }
        if (uVar2 < uVar3) {
          if ((SBORROW4(uVar2 * 7,uVar1 * 8) == (int)(uVar2 * 7 + uVar1 * -8) < 0) &&
             (__dest = (uchar *)malloc((ulong)uVar3), __dest != (uchar *)0x0)) {
            if (uVar1 != 0) {
              memcpy(__dest,__src,(long)(int)uVar1);
            }
            free(__src);
          }
          else {
            __dest = (uchar *)realloc(__src,(ulong)uVar3);
            if (__dest == (uchar *)0x0) {
              return -1;
            }
          }
          b->data = __dest;
          b->mlen = uVar3;
          __dest[b->slen] = '\0';
        }
      }
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int balloc (bstring b, int len) {
	if (b == NULL || b->data == NULL || b->slen < 0 || b->mlen <= 0 || 
	    b->mlen < b->slen || len <= 0) {
		return BSTR_ERR;
	}

	if (len >= b->mlen) {
		unsigned char * x;

		if ((len = snapUpSize (len)) <= b->mlen) return BSTR_OK;

		/* Assume probability of a non-moving realloc is 0.125 */
		if (7 * b->mlen < 8 * b->slen) {

			/* If slen is close to mlen in size then use realloc to reduce
			   the memory defragmentation */

			x = (unsigned char *) bstr__realloc (b->data, len);
			if (x == NULL) return BSTR_ERR;
		} else {

			/* If slen is not close to mlen then avoid the penalty of copying
			   the extra bytes that are allocated, but not considered part of
			   the string */

			x = (unsigned char *) bstr__alloc (len);
			if (x == NULL) {
				x = (unsigned char *) bstr__realloc (b->data, len);
				if (x == NULL) return BSTR_ERR;
			} else {
				if (b->slen) bstr__memcpy ((char *) x, (char *) b->data, b->slen);
				bstr__free (b->data);
			}
		}
		b->data = x;
		b->mlen = len;
		b->data[b->slen] = (unsigned char) '\0';
	}

	return BSTR_OK;
}